

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void doTruncatedFile(char *fileName,int64_t offset)

{
  char *__file;
  void *pvVar1;
  ssize_t sVar2;
  size_t __nbytes;
  int __fd;
  uint local_114;
  int readed;
  uint8_t *buffer;
  uint32_t bufSize;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string outName;
  undefined1 local_88 [8];
  File outFile;
  File f;
  int64_t offset_local;
  char *fileName_local;
  
  File::File((File *)&outFile.m_pos);
  File::File((File *)local_88);
  File::open((File *)&outFile.m_pos,fileName,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,fileName,&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bufSize,".back",(allocator<char> *)((long)&buffer + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 &local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufSize);
  std::__cxx11::string::~string((string *)&bufSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&buffer + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  __file = (char *)std::__cxx11::string::c_str();
  __nbytes = 0;
  File::open((File *)local_88,__file,2);
  buffer._0_4_ = 0x10000;
  pvVar1 = operator_new__(0x10000);
  File::seek((File *)&outFile.m_pos,offset,smBegin);
  __fd = (int)pvVar1;
  sVar2 = File::read((File *)&outFile.m_pos,__fd,(void *)0x10000,__nbytes);
  local_114 = (uint)sVar2;
  while (0 < (int)local_114) {
    File::write((File *)local_88,__fd,(void *)(ulong)local_114,__nbytes);
    sVar2 = File::read((File *)&outFile.m_pos,__fd,(void *)0x10000,__nbytes);
    local_114 = (uint)sVar2;
  }
  std::__cxx11::string::~string((string *)local_b8);
  File::~File((File *)local_88);
  File::~File((File *)&outFile.m_pos);
  return;
}

Assistant:

void doTruncatedFile(const char* fileName, const int64_t offset)
{
    File f;
    File outFile;

    f.open(fileName, File::ofRead);
    const std::string outName = std::string(fileName) + std::string(".back");
    outFile.open(outName.c_str(), File::ofWrite);

    constexpr uint32_t bufSize = 1024 * 64;
    const auto buffer = new uint8_t[bufSize];
    f.seek(offset);
    int readed = f.read(buffer, bufSize);
    while (readed > 0)
    {
        outFile.write(buffer, readed);
        readed = f.read(buffer, bufSize);
    }
}